

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeDataDrop(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name data)

{
  DataDrop *expr;
  Ok local_39;
  IRBuilder *local_38;
  char *local_30;
  IRBuilder *local_28;
  IRBuilder *this_local;
  Name data_local;
  
  local_30 = data.super_IString.str._M_str;
  local_38 = data.super_IString.str._M_len;
  local_28 = this;
  this_local = local_38;
  data_local.super_IString.str._M_len = (size_t)local_30;
  data_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  expr = Builder::makeDataDrop(&this->builder,data);
  push(this,(Expression *)expr);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_39);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeDataDrop(Name data) {
  push(builder.makeDataDrop(data));
  return Ok{};
}